

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

int __thiscall Catch::TablePrinter::open(TablePrinter *this,char *__file,int __oflag,...)

{
  bool bVar1;
  TablePrinter *pTVar2;
  char *pcVar3;
  ostream *poVar4;
  ColumnInfo *info;
  iterator __end3;
  iterator __begin3;
  vector<Catch::(anonymous_namespace)::ColumnInfo,_std::allocator<Catch::(anonymous_namespace)::ColumnInfo>_>
  *__range3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffb8;
  __normal_iterator<Catch::(anonymous_namespace)::ColumnInfo_*,_std::vector<Catch::(anonymous_namespace)::ColumnInfo,_std::allocator<Catch::(anonymous_namespace)::ColumnInfo>_>_>
  local_20;
  vector<Catch::(anonymous_namespace)::ColumnInfo,_std::allocator<Catch::(anonymous_namespace)::ColumnInfo>_>
  *local_18;
  TablePrinter *local_8;
  
  if ((this->m_isOpen & 1U) == 0) {
    this->m_isOpen = true;
    local_8 = this;
    Catch::operator<<();
    local_18 = &this->m_columnInfos;
    local_20._M_current =
         (ColumnInfo *)
         clara::std::
         vector<Catch::(anonymous_namespace)::ColumnInfo,_std::allocator<Catch::(anonymous_namespace)::ColumnInfo>_>
         ::begin((vector<Catch::(anonymous_namespace)::ColumnInfo,_std::allocator<Catch::(anonymous_namespace)::ColumnInfo>_>
                  *)in_stack_ffffffffffffffb8);
    clara::std::
    vector<Catch::(anonymous_namespace)::ColumnInfo,_std::allocator<Catch::(anonymous_namespace)::ColumnInfo>_>
    ::end((vector<Catch::(anonymous_namespace)::ColumnInfo,_std::allocator<Catch::(anonymous_namespace)::ColumnInfo>_>
           *)in_stack_ffffffffffffffb8);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<Catch::(anonymous_namespace)::ColumnInfo_*,_std::vector<Catch::(anonymous_namespace)::ColumnInfo,_std::allocator<Catch::(anonymous_namespace)::ColumnInfo>_>_>
                          *)this,(__normal_iterator<Catch::(anonymous_namespace)::ColumnInfo_*,_std::vector<Catch::(anonymous_namespace)::ColumnInfo,_std::allocator<Catch::(anonymous_namespace)::ColumnInfo>_>_>
                                  *)in_stack_ffffffffffffffb8);
      if (!bVar1) break;
      __gnu_cxx::
      __normal_iterator<Catch::(anonymous_namespace)::ColumnInfo_*,_std::vector<Catch::(anonymous_namespace)::ColumnInfo,_std::allocator<Catch::(anonymous_namespace)::ColumnInfo>_>_>
      ::operator*(&local_20);
      pTVar2 = Catch::operator<<(this,in_stack_ffffffffffffffb8);
      Catch::operator<<(pTVar2);
      __gnu_cxx::
      __normal_iterator<Catch::(anonymous_namespace)::ColumnInfo_*,_std::vector<Catch::(anonymous_namespace)::ColumnInfo,_std::allocator<Catch::(anonymous_namespace)::ColumnInfo>_>_>
      ::operator++(&local_20);
    }
    Catch::operator<<(this);
    poVar4 = this->m_os;
    pcVar3 = getLineOfChars<(char)45>();
    poVar4 = std::operator<<(poVar4,pcVar3);
    this = (TablePrinter *)std::operator<<(poVar4,"\n");
  }
  return (int)this;
}

Assistant:

void open() {
        if (!m_isOpen) {
            m_isOpen = true;
            *this << RowBreak();
            for (auto const& info : m_columnInfos)
                *this << info.name << ColumnBreak();
            *this << RowBreak();
            m_os << Catch::getLineOfChars<'-'>() << "\n";
        }
    }